

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CoverageBinsSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverageBinsSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::CoverageBinsArraySizeSyntax*&,slang::parsing::Token&,slang::syntax::CoverageBinInitializerSyntax&,slang::syntax::CoverageIffClauseSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,CoverageBinsArraySizeSyntax **args_4,
          Token *args_5,CoverageBinInitializerSyntax *args_6,CoverageIffClauseSyntax **args_7,
          Token *args_8)

{
  Token wildcard;
  Token keyword;
  Token name;
  Token equals;
  Token semi;
  CoverageBinsSyntax *this_00;
  CoverageBinsArraySizeSyntax **args_local_4;
  Token *args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (CoverageBinsSyntax *)allocate(this,0xa8,8);
  wildcard.kind = args_1->kind;
  wildcard._2_1_ = args_1->field_0x2;
  wildcard.numFlags.raw = (args_1->numFlags).raw;
  wildcard.rawLen = args_1->rawLen;
  wildcard.info = args_1->info;
  keyword.kind = args_2->kind;
  keyword._2_1_ = args_2->field_0x2;
  keyword.numFlags.raw = (args_2->numFlags).raw;
  keyword.rawLen = args_2->rawLen;
  keyword.info = args_2->info;
  name.kind = args_3->kind;
  name._2_1_ = args_3->field_0x2;
  name.numFlags.raw = (args_3->numFlags).raw;
  name.rawLen = args_3->rawLen;
  name.info = args_3->info;
  equals.kind = args_5->kind;
  equals._2_1_ = args_5->field_0x2;
  equals.numFlags.raw = (args_5->numFlags).raw;
  equals.rawLen = args_5->rawLen;
  equals.info = args_5->info;
  semi.kind = args_8->kind;
  semi._2_1_ = args_8->field_0x2;
  semi.numFlags.raw = (args_8->numFlags).raw;
  semi.rawLen = args_8->rawLen;
  semi.info = args_8->info;
  slang::syntax::CoverageBinsSyntax::CoverageBinsSyntax
            (this_00,args,wildcard,keyword,name,*args_4,equals,args_6,*args_7,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }